

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

string * vkt::pipeline::anon_unknown_0::getColorStr<float>
                   (string *__return_storage_ptr__,float *data,int numComponents,bool isUint,
                   bool isSint)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined3 in_register_00000009;
  undefined3 in_register_00000081;
  ulong uVar4;
  int iVar5;
  char *__s;
  ostringstream str;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = "i";
  if (CONCAT31(in_register_00000081,isSint) == 0) {
    pcVar1 = "";
  }
  __s = "u";
  if (CONCAT31(in_register_00000009,isUint) == 0) {
    __s = pcVar1;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec4(",5);
  if (0 < numComponents) {
    uVar4 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>((double)data[uVar4]);
      pcVar1 = "";
      if (uVar4 < 3) {
        pcVar1 = ", ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pcVar1,(ulong)((uint)(uVar4 < 3) * 2));
      uVar4 = uVar4 + 1;
    } while ((uint)numComponents != uVar4);
  }
  if (numComponents < 4) {
    iVar5 = 4 - numComponents;
    do {
      poVar3 = (ostream *)std::ostream::operator<<(local_1a8,(uint)(iVar5 == 1));
      pcVar1 = ", ";
      if (iVar5 == 1) {
        pcVar1 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,pcVar1,(ulong)((uint)(iVar5 != 1) * 2));
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getColorStr (const T* data, int numComponents, const bool isUint, const bool isSint)
{
	const int maxIndex = 3;  // 4 components max

	std::ostringstream str;
	str << (isUint ? "u" : isSint ? "i" : "") << "vec4(";

	for (int i = 0; i < numComponents; ++i)
	{
		str << data[i]
			<< (i < maxIndex ? ", " : "");
	}

	for (int i = numComponents; i < maxIndex + 1; ++i)
	{
		str << (i == maxIndex ? 1 : 0)
			<< (i <  maxIndex ? ", " : "");
	}

	str << ")";
	return str.str();
}